

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

void __thiscall
QScrollerPrivate::createScrollToSegments
          (QScrollerPrivate *this,qreal v,qreal deltaTime,qreal endPos,Orientation orientation,
          ScrollType type)

{
  bool bVar1;
  int in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  qreal qVar2;
  QScrollerPrivate *this_00;
  double startPos_00;
  double dVar3;
  double deltaPos_00;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  qreal deltaPos;
  qreal startPos;
  QScrollerPropertiesPrivate *sp;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  QMessageLogger *in_stack_ffffffffffffff40;
  QDebug *in_stack_ffffffffffffff48;
  qreal in_stack_ffffffffffffff50;
  qreal in_stack_ffffffffffffff58;
  qreal in_stack_ffffffffffffff60;
  qreal in_stack_ffffffffffffff68;
  ScrollType type_00;
  QScrollerPrivate *this_01;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 1) {
    QList<QScrollerPrivate::ScrollSegment>::clear
              ((QList<QScrollerPrivate::ScrollSegment> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  else {
    QList<QScrollerPrivate::ScrollSegment>::clear
              ((QList<QScrollerPrivate::ScrollSegment> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  lcScroller();
  anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa833e2);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (char *)0xa833fb);
    QMessageLogger::debug();
    QDebug::operator<<(in_stack_ffffffffffffff48,in_RDI);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    QDebug::operator<<(in_stack_ffffffffffffff48,in_RDI);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    QDebug::operator<<(in_stack_ffffffffffffff48,in_RDI);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff2c);
    QDebug::~QDebug(&local_20);
    local_10 = 0;
  }
  QScopedPointer<QScrollerPropertiesPrivate,_QScopedPointerDeleter<QScrollerPropertiesPrivate>_>::
  data((QScopedPointer<QScrollerPropertiesPrivate,_QScopedPointerDeleter<QScrollerPropertiesPrivate>_>
        *)(in_RDI + 0x20));
  if (in_ESI == 1) {
    in_stack_ffffffffffffff68 = QPointF::x((QPointF *)(in_RDI + 0x68));
    qVar2 = QPointF::x((QPointF *)(in_RDI + 0x78));
    this_00 = (QScrollerPrivate *)(in_stack_ffffffffffffff68 + qVar2);
  }
  else {
    in_stack_ffffffffffffff60 = QPointF::y((QPointF *)(in_RDI + 0x68));
    qVar2 = QPointF::y((QPointF *)(in_RDI + 0x78));
    this_00 = (QScrollerPrivate *)(in_stack_ffffffffffffff60 + qVar2);
  }
  startPos_00 = (in_XMM2_Qa - (double)this_00) * 0.5;
  qVar2 = 1.0;
  type_00 = (ScrollType)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  this_01 = this_00;
  pushSegment(this_00,type_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
              in_stack_ffffffffffffff50,(qreal)in_stack_ffffffffffffff48,1.0,
              (Type)((ulong)in_stack_ffffffffffffff38 >> 0x20),
              (Orientation)in_stack_ffffffffffffff38);
  dVar3 = in_XMM1_Qa * 0.7;
  deltaPos_00 = (double)this_00 + startPos_00;
  QEasingCurve::type();
  pushSegment(this_01,type_00,in_stack_ffffffffffffff60,in_XMM2_Qa,startPos_00,deltaPos_00,qVar2,
              (Type)((ulong)dVar3 >> 0x20),SUB84(dVar3,0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollerPrivate::createScrollToSegments(qreal v, qreal deltaTime, qreal endPos,
                                              Qt::Orientation orientation, ScrollType type)
{
    Q_UNUSED(v);

    if (orientation == Qt::Horizontal)
        xSegments.clear();
    else
        ySegments.clear();

    qCDebug(lcScroller) << "+++ createScrollToSegments: t:" << deltaTime << "ep:"
                        << endPos << "o:" << int(orientation);

    const QScrollerPropertiesPrivate *sp = properties.d.data();

    qreal startPos = (orientation == Qt::Horizontal) ? contentPosition.x() + overshootPosition.x()
                                                     : contentPosition.y() + overshootPosition.y();
    qreal deltaPos = (endPos - startPos) / 2;

    pushSegment(type, deltaTime * qreal(0.3), qreal(1.0), startPos, deltaPos, startPos + deltaPos,
                QEasingCurve::InQuad, orientation);
    pushSegment(type, deltaTime * qreal(0.7), qreal(1.0), startPos + deltaPos, deltaPos, endPos,
                sp->scrollingCurve.type(), orientation);
}